

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_function.cpp
# Opt level: O3

spv_result_t spvtools::val::FunctionPass(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  pointer ppVar2;
  pointer pIVar3;
  EnumSet<spv::Capability> *this;
  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
  *this_00;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  uint id;
  uint id_00;
  AddressingModel AVar8;
  Op OVar9;
  uint32_t id_01;
  StorageClass SVar10;
  Instruction *pIVar11;
  undefined8 *puVar12;
  __normal_iterator<const_spv::Op_*,_std::vector<spv::Op,_std::allocator<spv::Op>_>_> _Var13;
  Instruction *this_01;
  mapped_type *pmVar14;
  _Rb_tree_const_iterator<spvtools::val::Decoration> __it;
  Instruction *rhs;
  Instruction *pIVar15;
  mapped_type *pmVar16;
  _Rb_tree_node_base *p_Var17;
  _Base_ptr p_Var18;
  _Rb_tree_node_base *p_Var19;
  long lVar20;
  spv_result_t sVar21;
  char *pcVar22;
  ulong uVar23;
  _Rb_tree_header *p_Var24;
  pointer ppVar25;
  _Rb_tree_header *p_Var26;
  pointer pIVar27;
  size_t sVar28;
  string local_288;
  Instruction *local_268;
  uint local_25c;
  size_t local_258;
  string local_250;
  EnumSet<spv::Capability> *local_230;
  mapped_type *local_228;
  Instruction *local_220;
  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
  *local_218;
  size_t local_210;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  if (uVar1 == 0x39) {
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar11 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar11 != (Instruction *)0x0) && ((pIVar11->inst_).opcode == 0x36)) {
      pIVar15 = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
      if ((pIVar15 != (Instruction *)0x0) && ((pIVar15->inst_).result_id == (inst->inst_).type_id))
      {
        uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar11,3);
        pIVar15 = ValidationState_t::FindDef(_,uVar7);
        pIVar11 = inst;
        if ((pIVar15 == (Instruction *)0x0) || ((pIVar15->inst_).opcode != 0x21)) {
LAB_001cda16:
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,pIVar11);
          pcVar22 = "Missing function type definition.";
          lVar20 = 0x21;
        }
        else {
          if ((long)(pIVar15->words_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pIVar15->words_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2 ==
              ((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2) + -1) {
            if ((ulong)((long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_start) < 0x31) {
              return SPV_SUCCESS;
            }
            local_218 = &_->id_decorations_;
            local_230 = &_->module_capabilities_;
            local_258 = 2;
            sVar28 = 3;
            local_268 = inst;
            do {
              uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,sVar28);
              pIVar11 = ValidationState_t::FindDef(_,uVar7);
              if (pIVar11 == (Instruction *)0x0) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Missing argument ",0x11);
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                pcVar22 = " definition.";
                lVar20 = 0xc;
                goto LAB_001cda27;
              }
              local_220 = pIVar11;
              pIVar11 = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
              if (pIVar11 == (Instruction *)0x0) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Missing argument ",0x11);
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                pcVar22 = " type definition.";
                lVar20 = 0x11;
                goto LAB_001cda27;
              }
              local_210 = sVar28;
              local_25c = Instruction::GetOperandAs<unsigned_int>(pIVar15,local_258);
              this_01 = ValidationState_t::FindDef(_,local_25c);
              this_00 = local_218;
              if ((this_01 == (Instruction *)0x0) ||
                 ((pIVar11->inst_).result_id != (this_01->inst_).result_id)) {
                if ((_->options_->before_hlsl_legalization != true) ||
                   (((pIVar11->inst_).opcode != 0x20 || ((this_01->inst_).opcode != 0x20)))) {
LAB_001cdc95:
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,local_268);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"OpFunctionCall Argument <id> ",0x1d);
                  ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar7);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,local_288._M_dataplus._M_p,
                             local_288._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"s type does not match Function <id> ",0x24);
                  ValidationState_t::getIdName_abi_cxx11_(&local_250,_,local_25c);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,local_250._M_dataplus._M_p,
                             local_250._M_string_length);
                  pcVar22 = "s parameter type.";
                  lVar20 = 0x11;
                  goto LAB_001cd8a6;
                }
                local_208._0_4_ = (pIVar11->inst_).result_id;
                pmVar16 = std::
                          map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                          ::operator[](local_218,(key_type_conflict *)&local_208);
                local_208._0_4_ = (this_01->inst_).result_id;
                pmVar14 = std::
                          map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                          ::operator[](this_00,(key_type_conflict *)&local_208);
                p_Var18 = (pmVar14->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                p_Var24 = &(pmVar14->_M_t)._M_impl.super__Rb_tree_header;
                if ((_Rb_tree_header *)p_Var18 != p_Var24) {
                  p_Var26 = &(pmVar16->_M_t)._M_impl.super__Rb_tree_header;
                  local_228 = pmVar16;
                  do {
                    local_208._0_8_ = p_Var18 + 1;
                    __it._M_node = (local_228->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left
                    ;
                    while( true ) {
                      if ((_Rb_tree_header *)__it._M_node == p_Var26) goto LAB_001cdc95;
                      bVar5 = __gnu_cxx::__ops::_Iter_equals_val<spvtools::val::Decoration_const>::
                              operator()((_Iter_equals_val<spvtools::val::Decoration_const> *)
                                         &local_208,__it);
                      if (bVar5) break;
                      __it._M_node = (_Base_ptr)std::_Rb_tree_increment(__it._M_node);
                    }
                    if ((_Rb_tree_header *)__it._M_node == p_Var26) goto LAB_001cdc95;
                    p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
                  } while ((_Rb_tree_header *)p_Var18 != p_Var24);
                }
                id = Instruction::GetOperandAs<unsigned_int>(pIVar11,2);
                id_00 = Instruction::GetOperandAs<unsigned_int>(this_01,2);
                if (id != id_00) {
                  pIVar11 = ValidationState_t::FindDef(_,id);
                  rhs = ValidationState_t::FindDef(_,id_00);
                  bVar5 = ValidationState_t::LogicallyMatch(_,pIVar11,rhs,true);
                  if (!bVar5) goto LAB_001cdc95;
                }
              }
              AVar8 = ValidationState_t::addressing_model(_);
              sVar28 = local_210;
              inst = local_268;
              if ((AVar8 == AddressingModelLogical) &&
                 (((uVar1 = (this_01->inst_).opcode, uVar1 == 0x1141 || (uVar1 == 0x20)) &&
                  (_->options_->relax_logical_pointer == false)))) {
                SVar10 = Instruction::GetOperandAs<spv::StorageClass>(this_01,1);
                this = local_230;
                if (StorageBuffer < SVar10) {
LAB_001cdfa6:
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"Invalid storage class for pointer operand ",0x2a
                            );
                  ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar7);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,local_288._M_dataplus._M_p,
                             local_288._M_string_length);
                  sVar21 = local_208.error_;
                  goto LAB_001cd8d8;
                }
                if ((0x4d1U >> (SVar10 & 0x1f) & 1) == 0) {
                  if (SVar10 != StorageBuffer) goto LAB_001cdfa6;
                  if ((_->features_).variable_pointers == false) {
                    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"StorageBuffer pointer operand ",0x1e);
                    ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar7);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,local_288._M_dataplus._M_p,
                               local_288._M_string_length);
                    pcVar22 = " requires a variable pointers capability";
                    lVar20 = 0x28;
                    goto LAB_001cd63e;
                  }
                }
                uVar1 = (local_220->inst_).opcode;
                if (((uVar1 != 0x37) && (uVar1 != 0x3b)) && (uVar1 != 0x1142)) {
                  bVar5 = EnumSet<spv::Capability>::contains
                                    (local_230,CapabilityVariablePointersStorageBuffer);
                  bVar6 = EnumSet<spv::Capability>::contains(this,CapabilityVariablePointers);
                  if (((SVar10 != StorageClassUniformConstant) &&
                      (SVar10 != StorageBuffer || !bVar5)) &&
                     (SVar10 != StorageClassWorkgroup || !bVar6)) {
                    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Pointer operand ",0x10);
                    ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar7);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,local_288._M_dataplus._M_p,
                               local_288._M_string_length);
                    pcVar22 = " must be a memory object declaration";
                    lVar20 = 0x24;
                    goto LAB_001cd63e;
                  }
                }
              }
              sVar28 = sVar28 + 1;
              local_258 = local_258 + 1;
              if ((ulong)((long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) <= sVar28) {
                return SPV_SUCCESS;
              }
            } while( true );
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar22 = 
          "OpFunctionCall Function <id>\'s parameter count does not match the argument count.";
          lVar20 = 0x51;
        }
        goto LAB_001cda27;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"OpFunctionCall Result Type <id> ",0x20);
      ValidationState_t::getIdName_abi_cxx11_(&local_288,_,(inst->inst_).type_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_288._M_dataplus._M_p,local_288._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"s type does not match Function <id> ",0x24);
      ValidationState_t::getIdName_abi_cxx11_(&local_250,_,(pIVar15->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_250._M_dataplus._M_p,local_250._M_string_length);
      pcVar22 = "s return type.";
      lVar20 = 0xe;
      goto LAB_001cd8a6;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"OpFunctionCall Function <id> ",0x1d);
    ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,local_288._M_dataplus._M_p,local_288._M_string_length);
    pcVar22 = " is not a function.";
    lVar20 = 0x13;
LAB_001cd63e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar22,lVar20);
    sVar21 = local_208.error_;
LAB_001cd8d8:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (uVar1 != 0x37) {
      if (uVar1 != 0x36) {
        return SPV_SUCCESS;
      }
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,3);
      pIVar11 = ValidationState_t::FindDef(_,uVar7);
      if ((pIVar11 == (Instruction *)0x0) || ((pIVar11->inst_).opcode != 0x21)) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"OpFunction Function Type <id> ",0x1e);
        ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,local_288._M_dataplus._M_p,local_288._M_string_length);
        pcVar22 = " is not a function type.";
        lVar20 = 0x18;
        goto LAB_001cd63e;
      }
      uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar11,1);
      if (uVar7 == (inst->inst_).type_id) {
        puVar12 = (undefined8 *)operator_new(0x38);
        puVar12[6] = 0x500000146;
        puVar12[4] = 0x12700000126;
        puVar12[5] = 0x14500000128;
        puVar12[2] = 0x14b00000010;
        puVar12[3] = 0x12500000039;
        *puVar12 = 0x470000004a;
        puVar12[1] = 0xf00000124;
        ppVar25 = (inst->uses_).
                  super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar2 = (inst->uses_).
                 super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        sVar21 = SPV_SUCCESS;
        local_268 = inst;
        if (ppVar25 != ppVar2) {
          do {
            uVar4 = local_208._0_8_;
            pIVar11 = ppVar25->first;
            local_208._2_2_ = 0;
            local_208._0_2_ = (pIVar11->inst_).opcode;
            local_208._4_4_ = SUB84(uVar4,4);
            _Var13 = std::
                     __find_if<__gnu_cxx::__normal_iterator<spv::Op_const*,std::vector<spv::Op,std::allocator<spv::Op>>>,__gnu_cxx::__ops::_Iter_equals_val<spv::Op_const>>
                               (puVar12,puVar12 + 7,&local_208);
            if (((_Var13._M_current == (Op *)(puVar12 + 7)) &&
                (bVar5 = Instruction::IsNonSemantic(pIVar11), !bVar5)) &&
               (bVar5 = Instruction::IsDebugInfo(pIVar11), !bVar5)) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,pIVar11);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Invalid use of function result id ",0x22);
              ValidationState_t::getIdName_abi_cxx11_(&local_288,_,(local_268->inst_).result_id);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,local_288._M_dataplus._M_p,local_288._M_string_length
                        );
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,".",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_288._M_dataplus._M_p != &local_288.field_2) {
                operator_delete(local_288._M_dataplus._M_p,
                                local_288.field_2._M_allocated_capacity + 1);
              }
              DiagnosticStream::~DiagnosticStream(&local_208);
              sVar21 = local_208.error_;
              break;
            }
            ppVar25 = ppVar25 + 1;
          } while (ppVar25 != ppVar2);
        }
        operator_delete(puVar12,0x38);
        goto LAB_001cda3d;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"OpFunction Result Type <id> ",0x1c);
      ValidationState_t::getIdName_abi_cxx11_(&local_288,_,(inst->inst_).type_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_288._M_dataplus._M_p,local_288._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208," does not match the Function Type\'s return type <id> ",0x35
                );
      ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_250._M_dataplus._M_p,local_250._M_string_length);
      pcVar22 = ".";
      lVar20 = 1;
LAB_001cd8a6:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar22,lVar20);
      sVar21 = local_208.error_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001cd8d8;
    }
    sVar28 = inst->line_num_;
    if (sVar28 - 1 == 0) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
      pcVar22 = "Function parameter cannot be the first instruction.";
      lVar20 = 0x33;
LAB_001cda27:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar22,lVar20);
      sVar21 = local_208.error_;
    }
    else {
      pIVar3 = (_->ordered_instructions_).
               super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar20 = sVar28 - 2;
      if (lVar20 == 0) {
        uVar23 = 0;
        pIVar11 = pIVar3 + (sVar28 - 1);
      }
      else {
        pIVar27 = pIVar3 + (sVar28 - 2);
        uVar23 = 0;
        do {
          uVar1 = (pIVar27->inst_).opcode;
          pIVar11 = pIVar27;
          if (uVar1 == 0x36) break;
          uVar23 = uVar23 + (uVar1 == 0x37);
          pIVar27 = pIVar27 + -1;
          lVar20 = lVar20 + -1;
          pIVar11 = pIVar3 + 1;
        } while (lVar20 != 0);
      }
      if ((pIVar11->inst_).opcode != 0x36) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
        pcVar22 = "Function parameter must be preceded by a function.";
        lVar20 = 0x32;
        goto LAB_001cda27;
      }
      uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar11,3);
      pIVar15 = ValidationState_t::FindDef(_,uVar7);
      if (pIVar15 == (Instruction *)0x0) goto LAB_001cda16;
      if (uVar23 < ((long)(pIVar15->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pIVar15->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) - 3U) {
        uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar15,uVar23 + 2);
        pIVar11 = ValidationState_t::FindDef(_,uVar7);
        if ((pIVar11 == (Instruction *)0x0) ||
           (id_01 = (inst->inst_).type_id, id_01 != (pIVar11->inst_).result_id)) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"OpFunctionParameter Result Type <id> ",0x25);
          ValidationState_t::getIdName_abi_cxx11_(&local_288,_,(inst->inst_).type_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_288._M_dataplus._M_p,local_288._M_string_length);
          pcVar22 = " does not match the OpTypeFunction parameter type of the same index.";
          lVar20 = 0x44;
          goto LAB_001cd63e;
        }
        while( true ) {
          OVar9 = ValidationState_t::GetIdOpcode(_,id_01);
          if (OVar9 != OpTypeArray) break;
          pIVar11 = ValidationState_t::FindDef(_,id_01);
          id_01 = Instruction::GetOperandAs<unsigned_int>(pIVar11,1);
        }
        OVar9 = ValidationState_t::GetIdOpcode(_,id_01);
        if ((OVar9 != OpTypePointer) &&
           (OVar9 = ValidationState_t::GetIdOpcode(_,id_01), OVar9 != OpTypeUntypedPointerKHR)) {
          return SPV_SUCCESS;
        }
        pIVar11 = ValidationState_t::FindDef(_,id_01);
        SVar10 = Instruction::GetOperandAs<spv::StorageClass>(pIVar11,1);
        if (SVar10 == PhysicalStorageBuffer) {
          local_208._0_4_ = (inst->inst_).result_id;
          pmVar16 = std::
                    map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                    ::operator[](&_->id_decorations_,(key_type_conflict *)&local_208);
          p_Var18 = (pmVar16->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var24 = &(pmVar16->_M_t)._M_impl.super__Rb_tree_header;
          p_Var17 = p_Var18;
          if ((_Rb_tree_header *)p_Var18 == p_Var24) {
            bVar5 = false;
          }
          else {
            do {
              p_Var19 = p_Var17;
              if (p_Var17[1]._M_color == 0x14) break;
              p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
              p_Var19 = &p_Var24->_M_header;
            } while ((_Rb_tree_header *)p_Var17 != p_Var24);
            bVar5 = (_Rb_tree_header *)p_Var19 != p_Var24;
            do {
              p_Var17 = p_Var18;
              if (p_Var18[1]._M_color == 0x13) break;
              p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
              p_Var17 = &p_Var24->_M_header;
            } while ((_Rb_tree_header *)p_Var18 != p_Var24);
          }
          if ((_Rb_tree_header *)p_Var17 == p_Var24 && !bVar5) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"OpFunctionParameter ",0x14);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
            pcVar22 = ": expected Aliased or Restrict for PhysicalStorageBuffer pointer.";
            lVar20 = 0x41;
          }
          else {
            if (!bVar5 || (_Rb_tree_header *)p_Var17 == p_Var24) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"OpFunctionParameter ",0x14);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
            pcVar22 = 
            ": can\'t specify both Aliased and Restrict for PhysicalStorageBuffer pointer.";
            lVar20 = 0x4c;
          }
        }
        else {
          if ((pIVar11->inst_).opcode != 0x20) {
            return SPV_SUCCESS;
          }
          uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar11,2);
          pIVar11 = ValidationState_t::FindDef(_,uVar7);
          if ((pIVar11->inst_).opcode != 0x20) {
            return SPV_SUCCESS;
          }
          SVar10 = Instruction::GetOperandAs<spv::StorageClass>(pIVar11,1);
          if (SVar10 != PhysicalStorageBuffer) {
            return SPV_SUCCESS;
          }
          local_208._0_4_ = (inst->inst_).result_id;
          pmVar16 = std::
                    map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                    ::operator[](&_->id_decorations_,(key_type_conflict *)&local_208);
          p_Var18 = (pmVar16->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var24 = &(pmVar16->_M_t)._M_impl.super__Rb_tree_header;
          p_Var17 = p_Var18;
          if ((_Rb_tree_header *)p_Var18 == p_Var24) {
            bVar5 = false;
          }
          else {
            do {
              p_Var19 = p_Var17;
              if (p_Var17[1]._M_color == 0x14ec) break;
              p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
              p_Var19 = &p_Var24->_M_header;
            } while ((_Rb_tree_header *)p_Var17 != p_Var24);
            bVar5 = (_Rb_tree_header *)p_Var19 != p_Var24;
            do {
              p_Var17 = p_Var18;
              if (p_Var18[1]._M_color == 0x14eb) break;
              p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
              p_Var17 = &p_Var24->_M_header;
            } while ((_Rb_tree_header *)p_Var18 != p_Var24);
          }
          if ((_Rb_tree_header *)p_Var17 == p_Var24 && !bVar5) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"OpFunctionParameter ",0x14);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
            pcVar22 = 
            ": expected AliasedPointer or RestrictPointer for PhysicalStorageBuffer pointer.";
            lVar20 = 0x4f;
          }
          else {
            if (!bVar5 || (_Rb_tree_header *)p_Var17 == p_Var24) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"OpFunctionParameter ",0x14);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
            pcVar22 = 
            ": can\'t specify both AliasedPointer and RestrictPointer for PhysicalStorageBuffer pointer."
            ;
            lVar20 = 0x5a;
          }
        }
        goto LAB_001cda27;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"Too many OpFunctionParameters for ",0x22);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,": expected ",0xb);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208," based on the function\'s type",0x1d);
      sVar21 = local_208.error_;
    }
  }
  DiagnosticStream::~DiagnosticStream(&local_208);
LAB_001cda3d:
  if (sVar21 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar21;
}

Assistant:

spv_result_t FunctionPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpFunction:
      if (auto error = ValidateFunction(_, inst)) return error;
      break;
    case spv::Op::OpFunctionParameter:
      if (auto error = ValidateFunctionParameter(_, inst)) return error;
      break;
    case spv::Op::OpFunctionCall:
      if (auto error = ValidateFunctionCall(_, inst)) return error;
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}